

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.cpp
# Opt level: O0

bool isprime(ll p)

{
  initializer_list<long_long> __l;
  bool bVar1;
  iterator __first;
  iterator __last;
  difference_type dVar2;
  reference plVar3;
  int local_c4;
  ll lStack_c0;
  int i;
  ll ad;
  bool passed;
  ll a;
  iterator __end1;
  iterator __begin1;
  vector<long_long,_std::allocator<long_long>_> *__range1;
  ll d;
  int cnt;
  allocator<long_long> local_59;
  longlong local_58 [3];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<long_long,_std::allocator<long_long>_> wit;
  ll p_local;
  
  local_58[0] = 2;
  local_58[1] = 7;
  local_58[2] = 0x3d;
  local_40 = local_58;
  local_38 = 3;
  wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)p;
  std::allocator<long_long>::allocator(&local_59);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_30,__l,&local_59);
  std::allocator<long_long>::~allocator(&local_59);
  __first = std::vector<long_long,_std::allocator<long_long>_>::begin
                      ((vector<long_long,_std::allocator<long_long>_> *)local_30);
  __last = std::vector<long_long,_std::allocator<long_long>_>::end
                     ((vector<long_long,_std::allocator<long_long>_> *)local_30);
  dVar2 = std::
          count<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,long_long>
                    ((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                      )__last._M_current,
                     (longlong *)
                     &wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (dVar2 == 0) {
    if (((long)wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage < 2) ||
       ((long)wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage % 2 == 0)) {
      p_local._7_1_ = false;
    }
    else {
      d._0_4_ = 0;
      for (__range1 = (vector<long_long,_std::allocator<long_long>_> *)
                      ((long)wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + -1);
          (long)__range1 % 2 == 0;
          __range1 = (vector<long_long,_std::allocator<long_long>_> *)((long)__range1 / 2)) {
        d._0_4_ = (int)d + 1;
      }
      __end1 = std::vector<long_long,_std::allocator<long_long>_>::begin
                         ((vector<long_long,_std::allocator<long_long>_> *)local_30);
      a = (ll)std::vector<long_long,_std::allocator<long_long>_>::end
                        ((vector<long_long,_std::allocator<long_long>_> *)local_30);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                                    *)&a);
        if (!bVar1) break;
        plVar3 = __gnu_cxx::
                 __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                 ::operator*(&__end1);
        lStack_c0 = fastexp(*plVar3,(ll)__range1,
                            (ll)wit.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = lStack_c0 == 1;
        for (local_c4 = 0; local_c4 < (int)d; local_c4 = local_c4 + 1) {
          bVar1 = bVar1 || lStack_c0 ==
                           (long)wit.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + -1;
          lStack_c0 = (lStack_c0 * lStack_c0) %
                      (long)wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
        }
        if (!bVar1) {
          p_local._7_1_ = false;
          goto LAB_0014c0bd;
        }
        __gnu_cxx::
        __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
        operator++(&__end1);
      }
      p_local._7_1_ = true;
    }
  }
  else {
    p_local._7_1_ = true;
  }
LAB_0014c0bd:
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_30);
  return p_local._7_1_;
}

Assistant:

bool isprime(ll p) {
	vector<ll> wit = {2, 7, 61};
	// For p < 1e18, use 2, 3, 5, 7, 11, 13, 17, 19, 23, 29, 31, 37
	// plus KACTL mod_pow (which can multiply modulo m ≤ 1e18)
	if (count(wit.begin(), wit.end(), p))
		return true;
	if (p < 2 || !(p % 2))
		return false;
	int cnt = 0;
	ll d = p - 1;
	while (d % 2 == 0)
		d /= 2, cnt++;
	/// It's been proven testing only these witnesses suffices for all p that
	/// concern us
	for (ll a: wit) {
		bool passed = false;
		ll ad = fastexp(a, d, p);
		passed |= ad == 1;
		for (int i = 0; i < cnt; i++, ad = (ad * ad) % p)
			passed |= ad == p - 1;
		if (!passed)
			return false;
	}
	return true;
}